

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resonance.test.cpp
# Opt level: O2

void verifyChunk(Resonance *chunk)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  double local_d0;
  ITransientExpression local_c8;
  double *local_b8;
  WithinRelMatcher *local_b0;
  WithinRelMatcher local_a8;
  AssertionHandler catchAssertionHandler;
  
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x25;
  capturedExpression.m_size = 0x1b;
  capturedExpression.m_start = "1., WithinRel( chunk.ER() )";
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_a8,capturedExpression,
             ContinueOnFailure);
  local_d0 = 1.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             *(chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x26;
  capturedExpression_00.m_size = 0x28;
  capturedExpression_00.m_start = "1., WithinRel( chunk.resonanceEnergy() )";
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_a8,capturedExpression_00,
             ContinueOnFailure);
  local_d0 = 1.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             *(chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x27;
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "2., WithinRel( chunk.AJ() )";
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_a8,capturedExpression_01,
             ContinueOnFailure);
  local_d0 = 2.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       &DAT_00000028;
  capturedExpression_02.m_size = 0x1d;
  capturedExpression_02.m_start = "2., WithinRel( chunk.spin() )";
  macroName_02.m_size = 10;
  macroName_02.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_a8,capturedExpression_02,
             ContinueOnFailure);
  local_d0 = 2.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x29;
  capturedExpression_03.m_size = 0x1b;
  capturedExpression_03.m_start = "3., WithinRel( chunk.GN() )";
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)&local_a8,capturedExpression_03,
             ContinueOnFailure);
  local_d0 = 3.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2a;
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "3., WithinRel( chunk.neutronWidth() )";
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)&local_a8,capturedExpression_04,
             ContinueOnFailure);
  local_d0 = 3.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2b;
  capturedExpression_05.m_size = 0x1b;
  capturedExpression_05.m_start = "4., WithinRel( chunk.GG() )";
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)&local_a8,capturedExpression_05,
             ContinueOnFailure);
  local_d0 = 4.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2c;
  capturedExpression_06.m_size = 0x23;
  capturedExpression_06.m_start = "4., WithinRel( chunk.gammaWidth() )";
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)&local_a8,capturedExpression_06,
             ContinueOnFailure);
  local_d0 = 4.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2d;
  capturedExpression_07.m_size = 0x1c;
  capturedExpression_07.m_start = "5., WithinRel( chunk.GFA() )";
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)&local_a8,capturedExpression_07,
             ContinueOnFailure);
  local_d0 = 5.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2e;
  capturedExpression_08.m_size = 0x2a;
  capturedExpression_08.m_start = "5., WithinRel( chunk.firstFissionWidth() )";
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)&local_a8,capturedExpression_08,
             ContinueOnFailure);
  local_d0 = 5.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x2f;
  capturedExpression_09.m_size = 0x1c;
  capturedExpression_09.m_start = "6., WithinRel( chunk.GFB() )";
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)&local_a8,capturedExpression_09,
             ContinueOnFailure);
  local_d0 = 6.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x14f004;
  local_a8.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x30;
  capturedExpression_10.m_size = 0x2b;
  capturedExpression_10.m_start = "6., WithinRel( chunk.secondFissionWidth() )";
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)&local_a8,capturedExpression_10,
             ContinueOnFailure);
  local_d0 = 6.0;
  Catch::Matchers::WithinRel
            (&local_a8,
             (chunk->chunk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_c8.m_result = Catch::Matchers::WithinRelMatcher::match(&local_a8,&local_d0);
  local_c8.m_isBinaryExpression = true;
  local_c8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0017c320;
  local_b8 = &local_d0;
  local_b0 = &local_a8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8);
  Catch::ITransientExpression::~ITransientExpression(&local_c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_a8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const Resonance& chunk ) {

  CHECK_THAT( 1., WithinRel( chunk.ER() ) );
  CHECK_THAT( 1., WithinRel( chunk.resonanceEnergy() ) );
  CHECK_THAT( 2., WithinRel( chunk.AJ() ) );
  CHECK_THAT( 2., WithinRel( chunk.spin() ) );
  CHECK_THAT( 3., WithinRel( chunk.GN() ) );
  CHECK_THAT( 3., WithinRel( chunk.neutronWidth() ) );
  CHECK_THAT( 4., WithinRel( chunk.GG() ) );
  CHECK_THAT( 4., WithinRel( chunk.gammaWidth() ) );
  CHECK_THAT( 5., WithinRel( chunk.GFA() ) );
  CHECK_THAT( 5., WithinRel( chunk.firstFissionWidth() ) );
  CHECK_THAT( 6., WithinRel( chunk.GFB() ) );
  CHECK_THAT( 6., WithinRel( chunk.secondFissionWidth() ) );
}